

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O0

void __thiscall
highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::deleteFixup
          (RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *this,LinkType x,
          LinkType nilParent)

{
  bool bVar1;
  LinkType LVar2;
  Dir dir_00;
  LinkType LVar3;
  LinkType in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  LinkType w;
  LinkType p;
  Dir dir;
  Dir in_stack_ffffffffffffffb8;
  LinkType in_stack_ffffffffffffffbc;
  LinkType in_stack_ffffffffffffffc0;
  LinkType in_stack_ffffffffffffffc4;
  undefined4 local_30;
  undefined1 local_29;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_c;
  
  local_c = in_ESI;
  do {
    while( true ) {
      local_29 = false;
      if (local_c != *(int *)*in_RDI) {
        local_29 = isBlack((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffbc);
      }
      if (local_29 == false) {
        if (local_c != -1) {
          makeBlack((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
        }
        return;
      }
      local_30 = in_EDX;
      if (local_c != -1) {
        local_30 = getParent((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *
                             )CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             in_stack_ffffffffffffffbc);
      }
      LVar2 = getChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      dir_00 = (Dir)(local_c == LVar2);
      LVar2 = getChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      bVar1 = isRed((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
      if (bVar1) {
        makeBlack((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc);
        makeRed((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc);
        opposite(dir_00);
        rotate((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
               CONCAT44(LVar2,in_stack_ffffffffffffffe0),(LinkType)((ulong)in_RDI >> 0x20),
               (Dir)in_RDI);
        LVar2 = getChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      }
      getChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      bVar1 = isBlack((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc);
      if (bVar1) break;
LAB_005dea86:
      getChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      bVar1 = isBlack((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc);
      if (bVar1) {
        LVar3 = LVar2;
        opposite(dir_00);
        getChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                 CONCAT44(LVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
                 in_stack_ffffffffffffffb8);
        makeBlack((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                  CONCAT44(LVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
        makeRed((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                CONCAT44(LVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
        rotate((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
               CONCAT44(LVar3,in_stack_ffffffffffffffe0),(LinkType)((ulong)in_RDI >> 0x20),
               (Dir)in_RDI);
        LVar3 = getChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                         CONCAT44(LVar2,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
                         in_stack_ffffffffffffffb8);
        in_stack_ffffffffffffffc4 = LVar2;
        LVar2 = LVar3;
      }
      in_stack_ffffffffffffffbc = LVar2;
      LVar2 = in_stack_ffffffffffffffbc;
      getColor((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc);
      setColor((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      makeBlack((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc);
      getChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      makeBlack((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                in_stack_ffffffffffffffbc);
      opposite(dir_00);
      rotate((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
             CONCAT44(LVar2,in_stack_ffffffffffffffe0),(LinkType)((ulong)in_RDI >> 0x20),(Dir)in_RDI
            );
      local_c = *(int *)*in_RDI;
      in_stack_ffffffffffffffc0 = local_30;
    }
    getChild((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc
             ,in_stack_ffffffffffffffb8);
    bVar1 = isBlack((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffbc);
    if (!bVar1) goto LAB_005dea86;
    makeRed((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc)
    ;
    local_c = local_30;
  } while( true );
}

Assistant:

void deleteFixup(LinkType x, const LinkType nilParent) {
    while (x != rootNode && isBlack(x)) {
      Dir dir;

      LinkType p = x == kNoLink ? nilParent : getParent(x);
      dir = Dir(x == getChild(p, kLeft));
      LinkType w = getChild(p, dir);
      assert(w != kNoLink);

      if (isRed(w)) {
        makeBlack(w);
        makeRed(p);
        rotate(p, opposite(dir));
        assert((x == kNoLink && p == nilParent) ||
               (x != kNoLink && p == getParent(x)));
        w = getChild(p, dir);
        assert(w != kNoLink);
      }

      if (isBlack(getChild(w, kLeft)) && isBlack(getChild(w, kRight))) {
        makeRed(w);
        x = p;
      } else {
        if (isBlack(getChild(w, dir))) {
          makeBlack(getChild(w, opposite(dir)));
          makeRed(w);
          rotate(w, dir);
          assert((x == kNoLink && p == nilParent) ||
                 (x != kNoLink && p == getParent(x)));
          w = getChild(p, dir);
        }
        setColor(w, getColor(p));
        makeBlack(p);
        makeBlack(getChild(w, dir));
        rotate(p, opposite(dir));
        x = rootNode;
      }
    }

    if (x != kNoLink) makeBlack(x);
  }